

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microui.c
# Opt level: O3

int mu_pool_init(mu_Context *ctx,mu_PoolItem *items,int len,mu_Id id)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  int extraout_EDX;
  ulong uVar4;
  uint uVar5;
  
  if (0 < len) {
    uVar1 = ctx->frame;
    ctx = (mu_Context *)(ulong)uVar1;
    uVar3 = 0xffffffff;
    uVar4 = 0;
    uVar5 = uVar1;
    do {
      if (items[uVar4].last_update < (int)uVar5) {
        uVar3 = uVar4 & 0xffffffff;
        uVar5 = items[uVar4].last_update;
      }
      uVar4 = uVar4 + 1;
    } while ((uint)len != uVar4);
    if (-1 < (int)uVar3) {
      items[uVar3].id = id;
      items[uVar3].last_update = uVar1;
      return (int)uVar3;
    }
  }
  mu_pool_init_cold_1();
  iVar2 = ctx->frame;
  items[extraout_EDX].last_update = iVar2;
  return iVar2;
}

Assistant:

int mu_pool_init(mu_Context *ctx, mu_PoolItem *items, int len, mu_Id id) {
  int i, n = -1, f = ctx->frame;
  for (i = 0; i < len; i++) {
    if (items[i].last_update < f) {
      f = items[i].last_update;
      n = i;
    }
  }
  expect(n > -1);
  items[n].id = id;
  mu_pool_update(ctx, items, n);
  return n;
}